

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xmlXPathNodeSetGrow(xmlNodeSetPtr cur)

{
  uint uVar1;
  int iVar2;
  xmlNodePtr *ppxVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = cur->nodeMax;
  if ((int)uVar1 < 1) {
    uVar5 = 10;
  }
  else {
    if (9999999 < uVar1) {
      return -1;
    }
    uVar4 = uVar1 + 1 >> 1;
    uVar5 = uVar4 + uVar1;
    if (10000000 - uVar4 < uVar1) {
      uVar5 = 10000000;
    }
  }
  ppxVar3 = (xmlNodePtr *)(*xmlRealloc)(cur->nodeTab,(ulong)uVar5 << 3);
  if (ppxVar3 == (xmlNodePtr *)0x0) {
    iVar2 = -1;
  }
  else {
    cur->nodeMax = uVar5;
    cur->nodeTab = ppxVar3;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
xmlXPathNodeSetGrow(xmlNodeSetPtr cur) {
    xmlNodePtr *temp;
    int newSize;

    newSize = xmlGrowCapacity(cur->nodeMax, sizeof(temp[0]),
                              XML_NODESET_DEFAULT, XPATH_MAX_NODESET_LENGTH);
    if (newSize < 0)
        return(-1);
    temp = xmlRealloc(cur->nodeTab, newSize * sizeof(temp[0]));
    if (temp == NULL)
        return(-1);
    cur->nodeMax = newSize;
    cur->nodeTab = temp;

    return(0);
}